

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O2

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)

{
  int iVar1;
  ARKodeSPRKTable pAVar2;
  long lVar3;
  
  pAVar2 = ARKodeSPRKTable_Alloc(that_sprk_table->stages);
  pAVar2->q = that_sprk_table->q;
  iVar1 = pAVar2->stages;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pAVar2->ahat[lVar3] = that_sprk_table->ahat[lVar3];
    pAVar2->a[lVar3] = that_sprk_table->a[lVar3];
  }
  return pAVar2;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)
{
  int i                      = 0;
  ARKodeSPRKTable sprk_table = NULL;

  sprk_table = ARKodeSPRKTable_Alloc(that_sprk_table->stages);

  sprk_table->q = that_sprk_table->q;

  for (i = 0; i < sprk_table->stages; ++i)
  {
    sprk_table->ahat[i] = that_sprk_table->ahat[i];
    sprk_table->a[i]    = that_sprk_table->a[i];
  }

  return sprk_table;
}